

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>
::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<fmt::v5::char8_t>>::hex_writer>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>_>::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<fmt::v5::char8_t>_>::hex_writer>
             *this,char8_t **it)

{
  size_t sVar1;
  type pcVar2;
  char8_t *pcVar3;
  char8_t *in_RSI;
  unsigned_long in_RDI;
  char8_t *unaff_retaddr;
  char8_t **in_stack_ffffffffffffffd8;
  hex_writer *in_stack_ffffffffffffffe0;
  unsigned_long __n;
  
  __n = in_RDI;
  sVar1 = basic_string_view<char>::size((basic_string_view<char> *)(in_RDI + 8));
  if (sVar1 != 0) {
    in_stack_ffffffffffffffe0 =
         (hex_writer *)basic_string_view<char>::begin((basic_string_view<char> *)(in_RDI + 8));
    basic_string_view<char>::end((basic_string_view<char> *)(in_RDI + 8));
    pcVar2 = internal::copy_str<fmt::v5::char8_t,char_const*,fmt::v5::char8_t*>
                       ((char *)in_stack_ffffffffffffffe0,(char *)in_stack_ffffffffffffffd8,
                        (char8_t *)0x2e610d);
    *(type *)in_RSI = pcVar2;
  }
  pcVar3 = std::fill_n<fmt::v5::char8_t*,unsigned_long,fmt::v5::char8_t>(unaff_retaddr,__n,in_RSI);
  *(char8_t **)in_RSI = pcVar3;
  int_writer<unsigned_long_long,fmt::v5::basic_format_specs<fmt::v5::char8_t>>::hex_writer::
  operator()(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = internal::copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }